

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

QString * __thiscall
QSQLiteDriver::escapeIdentifier
          (QString *__return_storage_ptr__,QSQLiteDriver *this,QString *identifier,
          IdentifierType type)

{
  char16_t cVar1;
  char16_t *pcVar2;
  long lVar3;
  Data *pDVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  QStringView *pQVar8;
  long lVar9;
  char16_t *pcVar10;
  char16_t *pcVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QStringView local_b0;
  QStringView local_a0;
  QStringView local_90;
  QStringView local_80;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
  local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((identifier->d).size == 0) {
    pQVar8 = (QStringView *)0x0;
  }
  else {
    cVar5 = (**(code **)(*(long *)this + 0xf0))(this,identifier,type);
    pQVar8 = (QStringView *)(identifier->d).size;
    if (cVar5 == '\0') {
      local_70.a.a.a.a.a.b = (QStringView *)(identifier->d).ptr;
      local_70.a.a.a.a.a.a = pQVar8;
      uVar6 = QStringView::indexOf((QStringView *)&local_70,(QChar)0x2e,0,CaseSensitive);
      if (-1 < (long)uVar6) {
        pcVar2 = (identifier->d).ptr;
        lVar3 = (identifier->d).size;
        lVar9 = lVar3 - (uVar6 + 1);
        pcVar11 = L"\"";
        pcVar10 = L"\"";
        if (2 < uVar6) {
          cVar1 = *pcVar2;
          if (cVar1 == L'`') {
            bVar12 = pcVar2[uVar6 - 1] == L'`';
          }
          else if (cVar1 == L'[') {
            bVar12 = pcVar2[uVar6 - 1] == L']';
          }
          else {
            pcVar10 = L"\"";
            if (cVar1 != L'\"') goto LAB_00115fd2;
            bVar12 = pcVar2[uVar6 - 1] == L'\"';
          }
          pcVar10 = L"\"";
          if (bVar12) {
            pcVar10 = L"";
          }
        }
LAB_00115fd2:
        local_90.m_size = lVar9;
        local_90.m_data = pcVar2 + uVar6 + 1;
        local_80.m_size = uVar6;
        local_80.m_data = pcVar2;
        lVar7 = QtPrivate::qustrlen(pcVar10);
        if (2 < lVar9) {
          cVar1 = pcVar2[uVar6 + 1];
          if (cVar1 == L'`') {
            if (pcVar2[lVar3 + -1] == L'`') goto LAB_00116024;
          }
          else if (cVar1 == L'[') {
            if (pcVar2[lVar3 + -1] == L']') goto LAB_00116024;
          }
          else if ((cVar1 == L'\"') && (pcVar2[lVar3 + -1] == L'\"')) {
LAB_00116024:
            pcVar11 = L"";
          }
        }
        local_a0.m_size = lVar7;
        local_a0.m_data = pcVar10;
        local_b0.m_size = QtPrivate::qustrlen(pcVar11);
        local_b0.m_data = pcVar11;
        if (lVar7 == 0 || local_b0.m_size == 0) {
          local_70.a.a.a.a.a.a = &local_a0;
          local_70.a.a.a.a.a.b = &local_80;
          local_70.a.a.a.b = L'.';
          local_70.a.a.b = &local_b0;
          local_70.a.b = &local_90;
          local_70.a.a.a.a.b = local_70.a.a.a.a.a.a;
          local_70.b = local_70.a.a.b;
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
          ::convertTo<QString>(__return_storage_ptr__,&local_70);
          goto LAB_001160ac;
        }
      }
      local_70.a.a.a.a.a.a = (QStringView *)CONCAT62(local_70.a.a.a.a.a.a._2_6_,0x22);
      local_70.a.a.a.a.b = (QStringView *)CONCAT62(local_70.a.a.a.a.b._2_6_,0x22);
      local_70.a.a.a.a.a.b = (QStringView *)identifier;
      QStringBuilder<QStringBuilder<char16_t,_const_QString_&>,_char16_t>::convertTo<QString>
                (__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<char16_t,_const_QString_&>,_char16_t> *)&local_70);
      goto LAB_001160ac;
    }
  }
  pDVar4 = (identifier->d).d;
  (__return_storage_ptr__->d).d = pDVar4;
  (__return_storage_ptr__->d).ptr = (identifier->d).ptr;
  (__return_storage_ptr__->d).size = (qsizetype)pQVar8;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_001160ac:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QSQLiteDriver::escapeIdentifier(const QString &identifier, IdentifierType type) const
{
    Q_D(const QSQLiteDriver);
    if (identifier.isEmpty() || isIdentifierEscaped(identifier, type))
        return identifier;

    const auto indexOfSeparator = identifier.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{identifier}.first(indexOfSeparator);
        auto rightName = QStringView{identifier}.sliced(indexOfSeparator + 1);
        const QStringView leftEnclose = d->isIdentifierEscaped(leftName) ? u"" : u"\"";
        const QStringView rightEnclose = d->isIdentifierEscaped(rightName) ? u"" : u"\"";
        if (leftEnclose.isEmpty() || rightEnclose.isEmpty())
            return (leftEnclose + leftName + leftEnclose + u'.' + rightEnclose + rightName
                    + rightEnclose);
    }
    return u'"' + identifier + u'"';
}